

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::addIndex(PrimitiveRestartCase *this,deUint32 index)

{
  deUint32 local_1c;
  value_type_conflict5 local_18;
  value_type_conflict4 local_15;
  deUint32 local_14;
  PrimitiveRestartCase *pPStack_10;
  deUint32 index_local;
  PrimitiveRestartCase *this_local;
  
  local_14 = index;
  pPStack_10 = this;
  if (this->m_indexType == INDEX_UNSIGNED_BYTE) {
    local_15 = (value_type_conflict4)index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_indicesUB,&local_15);
  }
  else if (this->m_indexType == INDEX_UNSIGNED_SHORT) {
    local_18 = (value_type_conflict5)index;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_indicesUS,&local_18);
  }
  else if (this->m_indexType == INDEX_UNSIGNED_INT) {
    local_1c = index;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_indicesUI,&local_1c);
  }
  return;
}

Assistant:

void PrimitiveRestartCase::addIndex (deUint32 index)
{
	if (m_indexType == INDEX_UNSIGNED_BYTE)
	{
		DE_ASSERT(de::inRange(index, (deUint32)0, MAX_UNSIGNED_BYTE));
		m_indicesUB.push_back((deUint8)index);
	}
	else if (m_indexType == INDEX_UNSIGNED_SHORT)
	{
		DE_ASSERT(de::inRange(index, (deUint32)0, MAX_UNSIGNED_SHORT));
		m_indicesUS.push_back((deUint16)index);
	}
	else if (m_indexType == INDEX_UNSIGNED_INT)
	{
		DE_ASSERT(de::inRange(index, (deUint32)0, MAX_UNSIGNED_INT));
		m_indicesUI.push_back((deUint32)index);
	}
	else
		DE_ASSERT(DE_FALSE);
}